

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

void __thiscall DBOPL::Operator::Write60(Operator *this,Chip *chip,Bit8u val)

{
  byte bVar1;
  
  bVar1 = this->reg60 ^ val;
  this->reg60 = val;
  if ((bVar1 & 0xf) != 0) {
    UpdateDecay(this,chip);
  }
  if (bVar1 < 0x10) {
    return;
  }
  UpdateAttack(this,chip);
  return;
}

Assistant:

void Operator::Write60( const Chip* chip, Bit8u val ) {
	Bit8u change = reg60 ^ val;
	reg60 = val;
	if ( change & 0x0f ) {
		UpdateDecay( chip );
	}
	if ( change & 0xf0 ) {
		UpdateAttack( chip );
	}
}